

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.c
# Opt level: O2

void * work_routine(void *args)

{
  pthread_mutex_t *__mutex;
  undefined8 *__ptr;
  
  __mutex = (pthread_mutex_t *)((long)args + 0x50);
  while( true ) {
    pthread_mutex_lock(__mutex);
    while( true ) {
      __ptr = *(undefined8 **)((long)args + 0x18);
      if (__ptr != (undefined8 *)0x0) break;
      if (*args != 0) goto LAB_00105b07;
      pthread_cond_wait((pthread_cond_t *)((long)args + 0x20),__mutex);
    }
    if (*args != 0) break;
    *(undefined8 *)((long)args + 0x18) = __ptr[2];
    pthread_mutex_unlock(__mutex);
    (*(code *)*__ptr)(__ptr[1]);
    free(__ptr);
  }
LAB_00105b07:
  pthread_mutex_unlock(__mutex);
  pthread_exit((void *)0x0);
}

Assistant:

static void* work_routine(void* args)
{
   tpool_t* pool = (tpool_t*)args;
   tpool_work_t* work = NULL;
 
   while(1){
        pthread_mutex_lock(&pool->queue_lock);
        while(!pool->tpool_head && !pool->shutdown){ // if there is no works and pool is not shutdown, it should be suspended for being awake
            pthread_cond_wait(&pool->queue_ready,&pool->queue_lock);
        }
 
        if(pool->shutdown){
           pthread_mutex_unlock(&pool->queue_lock);//pool shutdown,release the mutex and exit
           pthread_exit(NULL);
        }
 
        /* tweak a work*/
        work = pool->tpool_head;
        pool->tpool_head = (tpool_work_t*)pool->tpool_head->next;
        pthread_mutex_unlock(&pool->queue_lock);
 
        work->work_routine(work->args);
 
        free(work);
   }
return NULL;
}